

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reap.cpp
# Opt level: O0

uint __thiscall Reap::pop(Reap *this)

{
  bool bVar1;
  uint uVar2;
  reference puVar3;
  int *piVar4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *in_RDI;
  uint j;
  uint diff;
  uint other;
  iterator p_1;
  uint tmp;
  iterator p;
  iterator q;
  iterator end;
  iterator begin;
  uint res;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *s;
  uint i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  int in_stack_ffffffffffffff9c;
  int in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_50;
  uint local_44;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  local_40;
  uint *local_38;
  uint *local_30;
  uint *local_28;
  uint local_1c;
  __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
  *local_18;
  uint local_c;
  
  local_c = *(uint *)((long)&in_RDI[1]._M_current + 4);
  while( true ) {
    local_18 = in_RDI + (ulong)local_c * 3 + 3;
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                       CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0));
    if (!bVar1) break;
    local_c = local_c + 1;
    *(uint *)((long)&in_RDI[1]._M_current + 4) = local_c;
  }
  if (local_c == 0) {
    local_1c = *(uint *)&in_RDI[1]._M_current;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::pop_back
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xe146dc);
  }
  else {
    local_1c = 0xffffffff;
    local_28 = (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                 (in_stack_ffffffffffffff88);
    local_30 = (uint *)std::end<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                 (in_stack_ffffffffffffff88);
    local_38 = (uint *)std::begin<std::vector<unsigned_int,std::allocator<unsigned_int>>>
                                 (in_stack_ffffffffffffff88);
    local_40._M_current = local_28;
    while (bVar1 = __gnu_cxx::operator!=
                             (in_RDI,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      *)in_stack_ffffffffffffff88), bVar1) {
      puVar3 = __gnu_cxx::
               __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
               ::operator*(&local_40);
      local_44 = *puVar3;
      if (local_44 < local_1c) {
        local_38 = local_40._M_current;
        local_1c = local_44;
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_40);
    }
    local_50._M_current = local_28;
    while (bVar1 = __gnu_cxx::operator!=
                             (in_RDI,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                      *)in_stack_ffffffffffffff88), bVar1) {
      bVar1 = __gnu_cxx::operator==
                        (in_RDI,(__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                                 *)in_stack_ffffffffffffff88);
      if (!bVar1) {
        puVar3 = __gnu_cxx::
                 __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                 ::operator*(&local_50);
        uVar2 = leading_zeroes_of_unsigned(*puVar3 ^ local_1c);
        in_stack_ffffffffffffffa4 = 0x20 - uVar2;
        std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back
                  ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                   CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                   (value_type_conflict *)
                   CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98));
        if (in_stack_ffffffffffffffa4 < *(uint *)((long)&in_RDI[1]._M_current + 4)) {
          *(uint *)((long)&in_RDI[1]._M_current + 4) = in_stack_ffffffffffffffa4;
        }
      }
      __gnu_cxx::
      __normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>::
      operator++(&local_50);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::clear
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)0xe1468f);
    if (((local_c != 0) && (*(uint *)&in_RDI[2]._M_current == local_c)) &&
       (bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                           CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)), bVar1)) {
      *(uint *)&in_RDI[2]._M_current = local_c - 1;
    }
  }
  if ((*(uint *)((long)&in_RDI[1]._M_current + 4) == local_c) &&
     (bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0)), bVar1)) {
    piVar4 = std::min<int>((int *)&stack0xffffffffffffffa0,(int *)&stack0xffffffffffffff9c);
    *(int *)((long)&in_RDI[1]._M_current + 4) = *piVar4;
  }
  in_RDI->_M_current = (uint *)((long)in_RDI->_M_current + -1);
  *(uint *)&in_RDI[1]._M_current = local_1c;
  return local_1c;
}

Assistant:

unsigned Reap::pop () {
  assert (num_elements > 0);
  unsigned i = min_bucket;
  for (;;) {
    assert (i < 33);
    assert (i <= max_bucket);
    std::vector<unsigned> &s = buckets[i];
    if (s.empty ()) {
      min_bucket = ++i;
      continue;
    }
    unsigned res;
    if (i) {
      res = UINT_MAX;
      const auto begin = std::begin (s);
      const auto end = std::end (s);
      auto q = std::begin (s);
      assert (begin < end);
      for (auto p = begin; p != end; ++p) {
        const unsigned tmp = *p;
        if (tmp >= res)
          continue;
        res = tmp;
        q = p;
      }

      for (auto p = begin; p != end; ++p) {
        if (p == q)
          continue;
        const unsigned other = *p;
        const unsigned diff = other ^ res;
        assert (sizeof (unsigned) == 4);
        const unsigned j = 32 - leading_zeroes_of_unsigned (diff);
        assert (j < i);
        buckets[j].push_back (other);
        if (min_bucket > j)
          min_bucket = j;
      }

      s.clear ();

      if (i && max_bucket == i) {
#ifndef NDEBUG
        for (unsigned j = i + 1; j < 33; j++)
          assert (buckets[j].empty ());
#endif
        if (s.empty ())
          max_bucket = i - 1;
      }
    } else {
      res = last_deleted;
      assert (!buckets[0].empty ());
      assert (buckets[0].at (0) == res);
      buckets[0].pop_back ();
    }

    if (min_bucket == i) {
#ifndef NDEBUG
      for (unsigned j = 0; j < i; j++)
        assert (buckets[j].empty ());
#endif
      if (s.empty ())
        min_bucket = std::min ((int) (i + 1), 32);
    }

    --num_elements;
    assert (last_deleted <= res);
    last_deleted = res;

    return res;
  }
}